

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O1

void __thiscall HdlcAnalyzer::ProcessAddressField(HdlcAnalyzer *this,HdlcByte byteAfterFlag)

{
  long lVar1;
  byte bVar2;
  byte local_99;
  U64 local_90;
  U64 UStack_88;
  ulong local_80;
  long local_78;
  undefined1 local_70;
  byte local_6f;
  U64 local_68;
  U64 UStack_60;
  vector<Frame,_std::allocator<Frame>_> *local_50;
  HdlcByte local_48;
  
  if (this->mAbortFrame == false) {
    if (((this->mSettings)._M_ptr)->mHdlcAddr == HDLC_BASIC_ADDRESS_FIELD) {
      local_68 = byteAfterFlag.startSample;
      UStack_60 = byteAfterFlag.endSample;
      Frame::Frame((Frame *)&local_90);
      local_90 = local_68;
      UStack_88 = UStack_60;
      local_70 = 1;
      local_78 = 0;
      local_6f = byteAfterFlag.escaped;
      local_80 = (ulong)byteAfterFlag.value;
      std::vector<Frame,_std::allocator<Frame>_>::push_back(&this->mResultFrames,(Frame *)&local_90)
      ;
      AnalyzerResults::AddMarker
                ((ulonglong)(this->mResults)._M_ptr,(MarkerType)local_90,(Channel *)0x8);
      Frame::~Frame((Frame *)&local_90);
    }
    else {
      local_68 = byteAfterFlag.endSample;
      local_99 = byteAfterFlag.escaped;
      AnalyzerResults::AddMarker
                ((ulonglong)(this->mResults)._M_ptr,(MarkerType)byteAfterFlag.startSample,
                 (Channel *)0x8);
      local_50 = &this->mResultFrames;
      lVar1 = 0;
      do {
        Frame::Frame((Frame *)&local_90);
        UStack_88 = local_68;
        local_70 = 2;
        local_90 = byteAfterFlag.startSample;
        local_80 = (ulong)byteAfterFlag.value;
        local_78 = lVar1;
        local_6f = local_99 & 1;
        std::vector<Frame,_std::allocator<Frame>_>::push_back(local_50,(Frame *)&local_90);
        if ((byteAfterFlag.value & 1) == 0) {
          bVar2 = 0;
        }
        else {
          ReadByte(&local_48,this);
          local_68 = local_48.endSample;
          local_99 = local_48.escaped;
          bVar2 = this->mAbortFrame ^ 1;
          byteAfterFlag.startSample = local_48.startSample;
          byteAfterFlag.value = local_48.value;
        }
        Frame::~Frame((Frame *)&local_90);
        lVar1 = lVar1 + 1;
      } while (bVar2 != 0);
    }
  }
  return;
}

Assistant:

void HdlcAnalyzer::ProcessAddressField( HdlcByte byteAfterFlag )
{
    if( mAbortFrame )
    {
        return;
    }

    if( mSettings->mHdlcAddr == HDLC_BASIC_ADDRESS_FIELD )
    {
        U8 flag = ( byteAfterFlag.escaped ) ? HDLC_ESCAPED_BYTE : 0;
        Frame frame =
            CreateFrame( HDLC_FIELD_BASIC_ADDRESS, byteAfterFlag.startSample, byteAfterFlag.endSample, byteAfterFlag.value, 0, flag );
        AddFrameToResults( frame );

        // Put a marker in the beggining of the HDLC frame
        mResults->AddMarker( frame.mStartingSampleInclusive, AnalyzerResults::Start, mSettings->mInputChannel );
    }
    else // HDLC_EXTENDED_ADDRESS_FIELD
    {
        int i = 0;
        HdlcByte addressByte = byteAfterFlag;
        // Put a marker in the beggining of the HDLC frame
        mResults->AddMarker( addressByte.startSample, AnalyzerResults::Start, mSettings->mInputChannel );
        for( ;; )
        {
            U8 flag = ( addressByte.escaped ) ? HDLC_ESCAPED_BYTE : 0;
            Frame frame =
                CreateFrame( HDLC_FIELD_EXTENDED_ADDRESS, addressByte.startSample, addressByte.endSample, addressByte.value, i++, flag );
            AddFrameToResults( frame );

            U8 lsbBit = addressByte.value & 0x01;
            if( !lsbBit ) // End of Extended Address Field?
            {
                return;
            }

            // Next address byte
            addressByte = ReadByte();
            if( mAbortFrame )
            {
                return;
            }
        }
    }
}